

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

void __thiscall QTextDocumentPrivate::contentsChanged(QTextDocumentPrivate *this)

{
  QTextDocument *this_00;
  bool _t1;
  
  if (this->editBlock != 0) {
    return;
  }
  this_00 = *(QTextDocument **)&this->field_0x8;
  _t1 = (bool)(this->undoEnabled ^ 1U | this->modifiedState != this->undoState);
  if (this->modified != _t1) {
    this->modified = _t1;
    QTextDocument::modificationChanged(this_00,_t1);
  }
  QTextDocument::contentsChanged(this_00);
  return;
}

Assistant:

void QTextDocumentPrivate::contentsChanged()
{
    Q_Q(QTextDocument);
    if (editBlock)
        return;

    bool m = undoEnabled ? (modifiedState != undoState) : true;
    if (modified != m) {
        modified = m;
        emit q->modificationChanged(modified);
    }

    emit q->contentsChanged();
}